

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O2

ValueFunctionPOMDPDiscrete *
AlphaVectorPruning::ParetoPrune
          (ValueFunctionPOMDPDiscrete *__return_storage_ptr__,ValueFunctionPOMDPDiscrete *Vin)

{
  bool bVar1;
  reference pvVar2;
  uint uVar3;
  ulong __n;
  ValueFunctionPOMDPDiscrete uset;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_138;
  AlphaVector u;
  AlphaVector local_f8;
  AlphaVector local_d0;
  AlphaVector v;
  AlphaVector local_80;
  AlphaVector local_58;
  
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector(&uset,Vin);
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while (uset.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         uset.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
         super__Vector_impl_data._M_start) {
    pvVar2 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at(&uset,0);
    AlphaVector::AlphaVector(&u,pvVar2);
    __n = 1;
    while( true ) {
      if ((ulong)(((long)uset.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)uset.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x28) <= __n) break;
      pvVar2 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at(&uset,__n);
      AlphaVector::AlphaVector(&v,pvVar2);
      AlphaVector::AlphaVector(&local_d0,&v);
      AlphaVector::AlphaVector(&local_58,&u);
      bVar1 = ParetoDominates(&local_d0,&local_58);
      AlphaVector::~AlphaVector(&local_58);
      AlphaVector::~AlphaVector(&local_d0);
      if (bVar1) {
        AlphaVector::operator=(&u,&v);
      }
      AlphaVector::~AlphaVector(&v);
      __n = (ulong)((int)__n + 1);
    }
    local_138.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar3 = 0;
    local_138.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      if ((ulong)(((long)uset.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)uset.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x28) <= (ulong)uVar3) break;
      pvVar2 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at(&uset,(ulong)uVar3);
      AlphaVector::AlphaVector(&v,pvVar2);
      AlphaVector::AlphaVector(&local_f8,&u);
      AlphaVector::AlphaVector(&local_80,&v);
      bVar1 = ParetoDominates(&local_f8,&local_80);
      AlphaVector::~AlphaVector(&local_80);
      AlphaVector::~AlphaVector(&local_f8);
      if (!bVar1) {
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back(&local_138,&v);
      }
      AlphaVector::~AlphaVector(&v);
      uVar3 = uVar3 + 1;
    }
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back(__return_storage_ptr__,&u);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator=(&uset,&local_138);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_138);
    AlphaVector::~AlphaVector(&u);
  }
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&uset);
  return __return_storage_ptr__;
}

Assistant:

ValueFunctionPOMDPDiscrete AlphaVectorPruning::ParetoPrune(const ValueFunctionPOMDPDiscrete &Vin)
{
    ValueFunctionPOMDPDiscrete uset = Vin;
    ValueFunctionPOMDPDiscrete result;
    while(uset.size()>0)
    {
        AlphaVector u = uset.at(0);
        for(Index i=1; i<uset.size();++i)
        {
            AlphaVector v = uset.at(i);
            if(ParetoDominates(v, u))
                u=v;
        }
        ValueFunctionPOMDPDiscrete uset2=ValueFunctionPOMDPDiscrete();
        for(Index i=0; i<uset.size();++i)
        {
            AlphaVector v = uset.at(i);
            if(!ParetoDominates(u, v))
                uset2.push_back(v);
        }
        result.push_back(u);
        uset=uset2;
    }

    return(result);
}